

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  wchar16 *baseURL;
  XSTSHarnessHandlers *this;
  long lVar7;
  char *pcVar8;
  ostream *poVar9;
  ulong uVar10;
  XMLCh *uniFile;
  RootExtractor rootExtractor;
  StrX local_78;
  wchar16 *local_70;
  undefined **local_68;
  undefined **local_60;
  undefined **local_58;
  undefined **local_50;
  undefined **local_48;
  undefined **local_40;
  char local_38;
  
  if (1 < argC) {
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    uVar10 = 1;
    do {
      pcVar8 = argV[uVar10];
      if (*pcVar8 != '-') goto LAB_00108147;
      iVar3 = strcmp(pcVar8,"-?");
      if (iVar3 == 0) {
        usage();
        return 2;
      }
      iVar3 = strncmp(pcVar8,"-scanner=",9);
      if (iVar3 == 0) {
        g_scanner = (XMLCh *)xercesc_4_0::XMLString::transcode
                                       (pcVar8 + 9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unknown option \'",0x10);
        pcVar8 = argV[uVar10];
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1140e8);
        }
        else {
          sVar4 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\', ignoring it\n",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
      }
      uVar10 = uVar10 + 1;
    } while ((uint)argC != uVar10);
    uVar10 = (ulong)(uint)argC;
LAB_00108147:
    if ((int)uVar10 == argC + -1) {
      plVar5 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                 (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                  (XMLGrammarPool *)0x0);
      (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
      (**(code **)(*plVar5 + 0x60))(plVar5,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
      pcVar8 = argV[uVar10 & 0xffffffff];
      local_68 = &PTR__DefaultHandler_00112388;
      local_60 = &PTR__RootExtractor_001124a0;
      local_58 = &PTR__RootExtractor_001124d8;
      local_50 = &PTR__RootExtractor_00112550;
      local_48 = &PTR__RootExtractor_00112590;
      local_40 = &PTR__RootExtractor_001125e8;
      local_38 = '\0';
      (**(code **)(*plVar5 + 0x40))(plVar5);
      (**(code **)(*plVar5 + 0x80))(plVar5,pcVar8);
      local_70 = (wchar16 *)
                 xercesc_4_0::XMLString::transcode
                           (pcVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      lVar6 = xercesc_4_0::XMLString::stringLen(pcVar8);
      uVar10 = 0xffffffffffffffff;
      if (-1 < lVar6 + 9) {
        uVar10 = lVar6 * 2 + 0x12;
      }
      baseURL = (wchar16 *)operator_new__(uVar10);
      xercesc_4_0::XMLString::fixURI(local_70,baseURL);
      if (local_38 == '\x01') {
        this = (XSTSHarnessHandlers *)operator_new(0x120);
        XMLHarnessHandlers::XMLHarnessHandlers((XMLHarnessHandlers *)this,baseURL,g_scanner);
      }
      else {
        this = (XSTSHarnessHandlers *)operator_new(0x3e0);
        XSTSHarnessHandlers::XSTSHarnessHandlers(this,baseURL,g_scanner);
      }
      xercesc_4_0::XMLString::release(&local_70,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      operator_delete__(baseURL);
      (**(code **)(*plVar5 + 0x40))
                (plVar5,&(this->super_BaseHarnessHandlers).super_DefaultHandler.super_ContentHandler
                );
      (**(code **)(*plVar5 + 0x58))
                (plVar5,&(this->super_BaseHarnessHandlers).super_DefaultHandler.super_ErrorHandler);
      lVar6 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*plVar5 + 0x80))(plVar5,pcVar8);
      lVar7 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      bVar1 = (this->super_BaseHarnessHandlers).fSawErrors;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Scanner: ",9);
      pcVar8 = (char *)xercesc_4_0::XMLString::transcode
                                 (g_scanner,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_78.fLocalForm = pcVar8;
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1140e8);
      }
      else {
        sVar4 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      StrX::~StrX(&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Total tests: ",0xf);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Failed tests: ",0x10);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Success rate: ",0x10);
      uVar2 = (this->super_BaseHarnessHandlers).fTests;
      poVar9 = std::ostream::_M_insert<double>
                         (((double)(uVar2 - (this->super_BaseHarnessHandlers).fFailures) /
                          (double)uVar2) * 100.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"%",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Duration: ",0xc);
      uVar10 = lVar7 - lVar6;
      if (60000 < uVar10) {
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,":",1);
        uVar10 = uVar10 % 60000;
      }
      if (uVar10 < 10000) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0",1);
      }
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      (**(code **)(*plVar5 + 8))(plVar5);
      (*(this->super_BaseHarnessHandlers).super_DefaultHandler.super_EntityResolver.
        _vptr_EntityResolver[1])(this);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return (uint)bVar1 << 2;
    }
  }
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cout << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
        // TODO: add option to generate the XML summarizing the result
        else if (!strncmp(argV[argInd], "-scanner=", 9))
        {
            g_scanner = XMLString::transcode(argV[argInd]+9);
        }
        else
        {
            std::cout << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    //
    //  Create a SAX parser object.
    //
    SAX2XMLReader* parser = XMLReaderFactory::createXMLReader();
    parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
    parser->setFeature(XMLUni::fgSAX2CoreValidation, false);

    const char* xmlFile = argV[argInd];

    // Discover if the test suite is the XML or XMLSchema one
    RootExtractor rootExtractor;
    parser->setContentHandler(&rootExtractor);
    try
    {
        parser->parse(xmlFile);
    }
    catch (...)
    {
    }

    XMLCh* uniFile = XMLString::transcode(xmlFile);
    XMLCh* uri = new XMLCh[XMLString::stringLen(xmlFile) + 9];
    XMLString::fixURI(uniFile, uri);
    BaseHarnessHandlers* handler=NULL;
    if(rootExtractor.isXMLSuite())
    {
        // XML Test Suite
        handler=new XMLHarnessHandlers(uri, g_scanner);
    }
    else
    {
        // XMLSchema Test Suite
        handler=new XSTSHarnessHandlers(uri, g_scanner);
    }
    XMLString::release(&uniFile);
    delete [] uri;
    parser->setContentHandler(handler);
    parser->setErrorHandler(handler);

    bool errorOccurred=false;
    const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propagate out of it.
    //
    try
    {
        parser->parse(xmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cout << "OutOfMemoryException" << std::endl;
        errorOccurred = true;
    }
    catch (const XMLException& e)
    {
        std::cout << "\nError during parsing: '" << xmlFile << "'\n"
            << "Exception message is:  \n"
            << StrX(e.getMessage()) << "\n" << std::endl;
        errorOccurred = true;
    }
    catch (...)
    {
        std::cout << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
        errorOccurred = true;
    }

    const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
    unsigned long duration = endMillis - startMillis;

    if (handler->getSawErrors())
        errorOccurred = true;

    std::cout << "Scanner: " << StrX(g_scanner) << std::endl;
    std::cout << "  Total tests: " << handler->getTotalTests() << std::endl;
    std::cout << "  Failed tests: " << handler->getFailedTests() << std::endl;
    std::cout << "  Success rate: " << ((double)(handler->getTotalTests()-handler->getFailedTests()))/(double)handler->getTotalTests()*100 << "%" << std::endl;
    std::cout << "  Duration: ";
    if(duration > 60000)
    {
        std::cout << duration/60000 << ":";
        duration=duration % 60000;
    }
    if(duration/1000 < 10)
        std::cout << "0";
    std::cout << duration/1000 << "." << duration % 1000 << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;
    delete handler;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}